

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O1

Gia_Man_t * Gia_ManInsertWin(Gia_Man_t *p,Vec_Int_t *vOuts,Gia_Man_t *pWin)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  Gia_Man_t *pGVar12;
  long lVar13;
  Gia_Obj_t *pGVar14;
  uint uVar15;
  long lVar16;
  Vec_Int_t *vPis;
  Vec_Int_t *vPos;
  Vec_Int_t *vAnds;
  Vec_Int_t *local_58;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  Gia_Man_t *local_40;
  Vec_Int_t *local_38;
  
  pcVar9 = (char *)0x0;
  Gia_ManPrepareWin(p,vOuts,&local_58,&local_50,&local_38,0);
  p_00 = Gia_ManStart((p->nObjs - local_38->nSize) + pWin->nObjs +
                      ~(pWin->vCos->nSize + pWin->vCis->nSize));
  pcVar2 = p->pName;
  if (pcVar2 != (char *)0x0) {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  local_48 = local_38;
  local_40 = pWin;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar13 = 0;
    do {
      iVar7 = pVVar11->pArray[lVar13];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00703974;
      pGVar14 = p->pObjs;
      if (pGVar14 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar3 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) {
LAB_00703993:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_00703993;
      pGVar14[iVar7].Value = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
      lVar13 = lVar13 + 1;
      pVVar11 = p->vCis;
    } while (lVar13 < pVVar11->nSize);
  }
  pGVar12 = local_40;
  pGVar14 = local_40->pObjs;
  pGVar14->Value = 0;
  lVar13 = (long)local_40->vCis->nSize;
  if (0 < lVar13) {
    piVar5 = local_40->vCis->pArray;
    lVar16 = 0;
    do {
      iVar7 = piVar5[lVar16];
      if (((long)iVar7 < 0) || (local_40->nObjs <= iVar7)) goto LAB_00703974;
      if (pGVar14 == (Gia_Obj_t *)0x0) break;
      if (local_58->nSize <= lVar16) goto LAB_007039d1;
      iVar1 = local_58->pArray[lVar16];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00703974;
      pGVar14[iVar7].Value = p->pObjs[iVar1].Value;
      lVar16 = lVar16 + 1;
    } while (lVar13 != lVar16);
  }
  Gia_ManHashAlloc(p_00);
  iVar7 = pGVar12->nObjs;
  if ((0 < iVar7) && (pGVar14 = pGVar12->pObjs, pGVar14 != (Gia_Obj_t *)0x0)) {
    lVar13 = 0;
    do {
      uVar3 = *(ulong *)pGVar14;
      if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
        if (((int)pGVar14[-(uVar3 & 0x1fffffff)].Value < 0) ||
           (uVar6 = (uint)(uVar3 >> 0x20), (int)pGVar14[-(ulong)(uVar6 & 0x1fffffff)].Value < 0))
        goto LAB_007039b2;
        uVar6 = Gia_ManHashAnd(p_00,pGVar14[-(uVar3 & 0x1fffffff)].Value ^ (uint)(uVar3 >> 0x1d) & 1
                               ,pGVar14[-(ulong)(uVar6 & 0x1fffffff)].Value ^ uVar6 >> 0x1d & 1);
        pGVar14->Value = uVar6;
      }
      lVar13 = lVar13 + 1;
      iVar7 = pGVar12->nObjs;
    } while ((lVar13 < iVar7) &&
            (pGVar14 = pGVar12->pObjs + lVar13, pGVar12->pObjs != (Gia_Obj_t *)0x0));
  }
  lVar13 = (long)pGVar12->vCos->nSize;
  if (0 < lVar13) {
    piVar5 = pGVar12->vCos->pArray;
    lVar16 = 0;
    do {
      iVar1 = piVar5[lVar16];
      if (((long)iVar1 < 0) || (iVar7 <= iVar1)) goto LAB_00703974;
      if (pGVar12->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar14 = pGVar12->pObjs + iVar1;
      uVar15 = (uint)*(undefined8 *)pGVar14;
      uVar6 = pGVar14[-(ulong)(uVar15 & 0x1fffffff)].Value;
      if ((int)uVar6 < 0) goto LAB_007039b2;
      if (local_50->nSize <= lVar16) {
LAB_007039d1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = local_50->pArray[lVar16];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00703974;
      p->pObjs[iVar1].Value = uVar15 >> 0x1d & 1 ^ uVar6;
      lVar16 = lVar16 + 1;
    } while (lVar13 != lVar16);
  }
  if (0 < p->nObjs) {
    lVar13 = 8;
    lVar16 = 0;
    do {
      pGVar14 = p->pObjs;
      if (pGVar14 == (Gia_Obj_t *)0x0) break;
      uVar3 = *(ulong *)((long)pGVar14 + lVar13 + -8);
      if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
        if (p->nTravIdsAlloc <= lVar16) {
          __assert_fail("Id < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
        }
        if (p->pTravIds[lVar16] != p->nTravIds) {
          uVar6 = *(uint *)((long)pGVar14 +
                           lVar13 + (ulong)(uint)((int)(uVar3 & 0x1fffffff) << 2) * -3);
          if (((int)uVar6 < 0) ||
             (uVar15 = *(uint *)((long)pGVar14 +
                                lVar13 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar15 < 0)) goto LAB_007039b2;
          iVar7 = Gia_ManHashAnd(p_00,uVar6 ^ (uint)(uVar3 >> 0x1d) & 1,
                                 uVar15 ^ (uint)(uVar3 >> 0x3d) & 1);
          *(int *)(&pGVar14->field_0x0 + lVar13) = iVar7;
        }
      }
      lVar16 = lVar16 + 1;
      lVar13 = lVar13 + 0xc;
    } while (lVar16 < p->nObjs);
  }
  pVVar11 = p->vCos;
  if (0 < pVVar11->nSize) {
    lVar13 = 0;
    do {
      iVar7 = pVVar11->pArray[lVar13];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_00703974:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar14 = p->pObjs + iVar7;
      uVar15 = (uint)*(undefined8 *)pGVar14;
      uVar6 = pGVar14[-(ulong)(uVar15 & 0x1fffffff)].Value;
      if ((int)uVar6 < 0) {
LAB_007039b2:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar15 >> 0x1d & 1 ^ uVar6);
      lVar13 = lVar13 + 1;
      pVVar11 = p->vCos;
    } while (lVar13 < pVVar11->nSize);
  }
  Gia_ManHashStop(p_00);
  if (local_58->pArray != (int *)0x0) {
    free(local_58->pArray);
    local_58->pArray = (int *)0x0;
  }
  pVVar11 = local_48;
  if (local_58 != (Vec_Int_t *)0x0) {
    free(local_58);
  }
  if (local_50->pArray != (int *)0x0) {
    free(local_50->pArray);
    local_50->pArray = (int *)0x0;
  }
  if (local_50 != (Vec_Int_t *)0x0) {
    free(local_50);
  }
  if (pVVar11->pArray != (int *)0x0) {
    free(pVVar11->pArray);
    pVVar11->pArray = (int *)0x0;
  }
  if (pVVar11 != (Vec_Int_t *)0x0) {
    free(pVVar11);
  }
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_ManInsertWin( Gia_Man_t * p, Vec_Int_t * vOuts, Gia_Man_t * pWin )
{
    Vec_Int_t * vPos, * vPis, * vAnds;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManPrepareWin( p, vOuts, &vPis, &vPos, &vAnds, 0 );
    // create AIG
    pNew = Gia_ManStart( Gia_ManObjNum(p) - Vec_IntSize(vAnds) + Gia_ManAndNum(pWin) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // inputs
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManConst0(pWin)->Value = 0;
    Gia_ManForEachCi( pWin, pObj, i )
        pObj->Value = Gia_ManObj(p, Vec_IntEntry(vPis, i))->Value;
    // internal nodes
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachAnd( pWin, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pWin, pObj, i )
        Gia_ManObj( p, Vec_IntEntry(vPos, i) )->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachAnd( p, pObj, i )
        if ( !Gia_ObjIsTravIdCurrentId(p, i) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    // cleanup
    Vec_IntFree( vPis );
    Vec_IntFree( vPos );
    Vec_IntFree( vAnds );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}